

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O0

Vector_Dense<double,_3UL> *
Disa::operator*(Vector_Dense<double,_3UL> *__return_storage_ptr__,Matrix_Sparse *matrix,
               Vector_Dense<double,_3UL> *vector)

{
  source_location *psVar1;
  source_location *psVar2;
  ostream *poVar3;
  size_t sVar4;
  size_type __val;
  anon_class_16_2_64c6d03b local_1c8;
  function<double_(unsigned_long)> local_1b8;
  undefined **local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  array<double,_3UL> *local_18;
  Vector_Dense<double,_3UL> *vector_local;
  Matrix_Sparse *matrix_local;
  
  local_18 = &vector->super_array<double,_3UL>;
  vector_local = (Vector_Dense<double,_3UL> *)matrix;
  psVar1 = (source_location *)Matrix_Sparse::size_column(matrix);
  psVar2 = (source_location *)std::array<double,_3UL>::size(local_18);
  if (psVar1 != psVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001f5f00;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,psVar2);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    sVar4 = Matrix_Sparse::size_row((Matrix_Sparse *)vector_local);
    std::__cxx11::to_string(&local_130,sVar4);
    std::operator+(&local_110,"Incompatible vector-matrix dimensions, ",&local_130);
    std::operator+(&local_f0,&local_110,",");
    sVar4 = Matrix_Sparse::size_column((Matrix_Sparse *)vector_local);
    std::__cxx11::to_string(&local_150,sVar4);
    std::operator+(&local_d0,&local_f0,&local_150);
    std::operator+(&local_b0,&local_d0," vs. ");
    __val = std::array<double,_3UL>::size(local_18);
    std::__cxx11::to_string(&local_170,__val);
    std::operator+(&local_90,&local_b0,&local_170);
    std::operator+(&local_70,&local_90,".");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  psVar1 = (source_location *)Matrix_Sparse::size_row((Matrix_Sparse *)vector_local);
  psVar2 = (source_location *)std::array<double,_3UL>::size(local_18);
  if (psVar1 != psVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_198 = &PTR_s__workspace_llm4binary_github_lic_001f5f18;
    console_format_abi_cxx11_(&local_190,(Disa *)0x0,(Log_Level)&local_198,psVar2);
    poVar3 = std::operator<<(poVar3,(string *)&local_190);
    poVar3 = std::operator<<(poVar3,"For static vectors the matrix must be square.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_190);
    exit(1);
  }
  local_1c8.matrix = (Matrix_Sparse *)vector_local;
  local_1c8.vector = (Vector_Dense<double,_3UL> *)local_18;
  std::function<double(unsigned_long)>::operator*
            ((function<double(unsigned_long)> *)&local_1b8,&local_1c8);
  sVar4 = Matrix_Sparse::size_row((Matrix_Sparse *)vector_local);
  Vector_Dense<double,_3UL>::Vector_Dense(__return_storage_ptr__,&local_1b8,sVar4);
  std::function<double_(unsigned_long)>::~function(&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

Vector_Dense<Scalar, _size> operator*(const Matrix_Sparse& matrix, const Vector_Dense<Scalar, _size>& vector) {
  ASSERT_DEBUG(matrix.size_column() == vector.size(),
               "Incompatible vector-matrix dimensions, " + std::to_string(matrix.size_row()) + "," +
               std::to_string(matrix.size_column()) + " vs. " + std::to_string(vector.size()) + ".");
  ASSERT_DEBUG(!_size || matrix.size_row() == vector.size(), "For static vectors the matrix must be square.");
  return Vector_Dense<Scalar, _size>(
  [&](const std::size_t i_row, Scalar value = 0) {
    FOR_ITER(iter, *(matrix.begin() + i_row)) value += *iter * vector[iter.i_column()];
    return value;
  },
  matrix.size_row());
}